

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

void __thiscall mjs::anon_unknown_46::stringify_state::nest::~nest(nest *this)

{
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *this_00;
  
  this_00 = (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *)
            gc_heap_ptr_untyped::get(&(this->state_->stack_).super_gc_heap_ptr_untyped);
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>::pop_back(this_00);
  std::__cxx11::wstring::_M_assign((wstring *)&this->state_->indent_);
  std::__cxx11::wstring::~wstring((wstring *)&this->step_back_);
  return;
}

Assistant:

~nest() {
            state_.pop();
            state_.indent_ = step_back_;
        }